

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O2

XMLSize_t __thiscall
xercesc_4_0::XMLReader::xcodeMoreChars
          (XMLReader *this,XMLCh *bufToFill,uchar *charSizes,XMLSize_t maxChars)

{
  byte bVar1;
  int iVar2;
  XMLSize_t XVar3;
  ulong uVar4;
  undefined4 extraout_var;
  bool bVar5;
  ulong uVar6;
  XMLSize_t bytesEaten;
  long local_40;
  XMLSize_t local_38;
  
  local_40 = 0;
  XVar3 = 0;
  bVar1 = 0;
  local_38 = maxChars;
  do {
    bVar5 = true;
    while( true ) {
      if (!bVar5) {
        return XVar3;
      }
      XVar3 = this->fRawBufIndex;
      uVar6 = this->fRawBytesAvail - XVar3;
      if (((bool)(uVar6 == 0 | bVar1)) || (uVar4 = uVar6, uVar6 < this->fLowWaterMark)) {
        refreshRawBuffer(this);
        if (this->fRawBytesAvail == 0) {
          return 0;
        }
        XVar3 = this->fRawBufIndex;
        uVar4 = this->fRawBytesAvail - XVar3;
        if ((bool)(bVar1 & uVar6 == uVar4)) {
          return 0;
        }
      }
      iVar2 = (*this->fTranscoder->_vptr_XMLTranscoder[2])
                        (this->fTranscoder,this->fRawByteBuf + XVar3,uVar4,bufToFill,local_38,
                         &local_40,charSizes);
      XVar3 = CONCAT44(extraout_var,iVar2);
      if (local_40 == 0) break;
      this->fRawBufIndex = this->fRawBufIndex + local_40;
      bVar5 = false;
    }
    bVar1 = 1;
  } while( true );
}

Assistant:

XMLSize_t
XMLReader::xcodeMoreChars(          XMLCh* const            bufToFill
                            ,       unsigned char* const    charSizes
                            , const XMLSize_t               maxChars)
{
    XMLSize_t charsDone = 0;
    XMLSize_t bytesEaten = 0;
    bool needMode = false;

    while (!bytesEaten)
    {
        // If our raw buffer is low, then lets load up another batch of
        // raw bytes now.
        //
        XMLSize_t bytesLeft = fRawBytesAvail - fRawBufIndex;
        if (needMode || bytesLeft == 0 || bytesLeft < fLowWaterMark)
        {
            refreshRawBuffer();

            // If there are no characters or if we need more but didn't get
            // any, return zero now.
            //
            if (fRawBytesAvail == 0 ||
                (needMode && (bytesLeft == fRawBytesAvail - fRawBufIndex)))
                return 0;
        }

        // Ask the transcoder to internalize another batch of chars. It is
        // possible that there is data in the raw buffer but the transcoder
        // is unable to produce anything because transcoding of multi-byte
        // encodings may have left a few bytes representing a partial
        // character in the buffer that can't be used until the next chunk
        // (and the rest of the character) is read. In this case set the
        // needMore flag and try again.
        //

        charsDone = fTranscoder->transcodeFrom
          (
            &fRawByteBuf[fRawBufIndex]
            , fRawBytesAvail - fRawBufIndex
            , bufToFill
            , maxChars
            , bytesEaten
            , charSizes
          );

        if (bytesEaten == 0)
            needMode = true;
        else
            fRawBufIndex += bytesEaten;
    }

    return charsDone;
}